

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptSession.cpp
# Opt level: O0

Diagnostics * __thiscall slang::ast::ScriptSession::getDiagnostics(ScriptSession *this)

{
  bool bVar1;
  element_type *this_00;
  SourceManager *sourceManager;
  EvalContext *in_RSI;
  Diagnostics *in_RDI;
  shared_ptr<slang::syntax::SyntaxTree> *tree;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *__range2;
  Diagnostics *result;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *in_stack_fffffffffffffe88;
  __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
  *in_stack_fffffffffffffe90;
  Compilation *in_stack_fffffffffffffe98;
  SmallVectorBase<slang::Diagnostic> *in_stack_fffffffffffffea0;
  __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
  local_28;
  char *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  Diagnostics::Diagnostics((Diagnostics *)0x6c75ae);
  local_20 = in_RSI[3].warnings.super_SmallVector<slang::Diagnostic,_2UL>.
             super_SmallVectorBase<slang::Diagnostic>.firstElement + 0x48;
  local_28._M_current =
       (shared_ptr<slang::syntax::SyntaxTree> *)
       std::
       vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
       ::begin(in_stack_fffffffffffffe88);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::end(in_stack_fffffffffffffe88);
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                           (in_stack_fffffffffffffe90,
                            (__normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                             *)in_stack_fffffffffffffe88), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
    ::operator*(&local_28);
    this_00 = std::
              __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x6c762a);
    in_stack_fffffffffffffea0 =
         (SmallVectorBase<slang::Diagnostic> *)slang::syntax::SyntaxTree::diagnostics(this_00);
    SmallVectorBase<slang::Diagnostic>::append_range<slang::Diagnostics>
              (in_stack_fffffffffffffea0,(Diagnostics *)in_stack_fffffffffffffe98);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
    ::operator++(&local_28);
  }
  sourceManager = (SourceManager *)Compilation::getAllDiagnostics(in_stack_fffffffffffffe98);
  SmallVectorBase<slang::Diagnostic>::append_range<slang::Diagnostics>
            (in_stack_fffffffffffffea0,(Diagnostics *)sourceManager);
  EvalContext::getAllDiagnostics(in_RSI);
  SmallVectorBase<slang::Diagnostic>::append_range<slang::Diagnostics>
            (in_stack_fffffffffffffea0,(Diagnostics *)sourceManager);
  Diagnostics::~Diagnostics((Diagnostics *)0x6c76cd);
  slang::syntax::SyntaxTree::getDefaultSourceManager();
  Diagnostics::sort((Diagnostics *)in_stack_fffffffffffffea0,sourceManager);
  return in_RDI;
}

Assistant:

Diagnostics ScriptSession::getDiagnostics() {
    Diagnostics result;
    for (auto& tree : syntaxTrees)
        result.append_range(tree->diagnostics());

    result.append_range(compilation.getAllDiagnostics());
    result.append_range(evalContext.getAllDiagnostics());
    result.sort(SyntaxTree::getDefaultSourceManager());
    return result;
}